

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  bool bVar1;
  int iVar2;
  VarType type;
  BasicTypeIterator basicIt;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  VarType local_78;
  SubTypeIterator<glu::IsBasicType> local_60;
  TypeAccessFormat local_40;
  
  if (*(char *)((long)this + 0x40) == '\x01') {
    glu::VarType::VarType(&local_78,(VarType *)((long)this + 0x28),arraySize);
  }
  else {
    glu::VarType::VarType(&local_78,(VarType *)((long)this + 0x28));
  }
  glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&local_60,&local_78);
  iVar2 = subobjectIndex + 1;
  do {
    local_88._M_allocated_capacity = 0;
    local_88._8_8_ = (pointer)0x0;
    local_98._0_8_ = (VarType *)0x0;
    local_98._8_8_ = (pointer)0x0;
    bVar1 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                      (&local_60,(SubTypeIterator<glu::IsBasicType> *)local_98);
    std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::~_Vector_base
              ((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
               (local_98 + 8));
    if (!bVar1) {
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&local_60.m_path.
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,(char *)0x0,(allocator<char> *)&local_60);
LAB_0071586f:
      glu::VarType::~VarType(&local_78);
      return __return_storage_ptr__;
    }
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      local_40.type = &local_78;
      local_40.path = &local_60.m_path;
      de::toString<glu::TypeAccessFormat>((string *)local_98,&local_40);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)this + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&local_60.m_path.
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      goto LAB_0071586f;
    }
    glu::SubTypeIterator<glu::IsBasicType>::operator++(&local_60);
  } while( true );
}

Assistant:

std::string Variable::basicSubobjectAtIndex (const int subobjectIndex, const int arraySize) const
{
	const glu::VarType	type		 = m_isArray ? glu::VarType(m_type, arraySize) : m_type;
	int					currentIndex = 0;

	for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&type); basicIt != glu::BasicTypeIterator::end(&type); ++basicIt)
	{
		if (currentIndex == subobjectIndex)
			return m_name + de::toString(glu::TypeAccessFormat(type, basicIt.getPath()));
		++currentIndex;
	}
	DE_ASSERT(false);
	return DE_NULL;
}